

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint local_78;
  char *local_70;
  int k_1;
  int b_1;
  char *vn;
  int t;
  int k;
  int b;
  OpCode op;
  Instruction i;
  TString *usertype;
  ravi_type_map type;
  int pc;
  char **name_local;
  int reg_local;
  int lastpc_local;
  Proto *p_local;
  
  _type = name;
  name_local._0_4_ = reg;
  name_local._4_4_ = lastpc;
  _reg_local = p;
  pcVar3 = luaF_getlocalname(p,reg + 1,lastpc,(ravi_type_map *)&usertype,(TString **)&op);
  *_type = pcVar3;
  if (*_type != (char *)0x0) {
    p_local = (Proto *)0x1a0b12;
    return (char *)p_local;
  }
  usertype._4_4_ = findsetreg(_reg_local,name_local._4_4_,(int)name_local);
  if (usertype._4_4_ != -1) {
    local_78 = _reg_local->code[usertype._4_4_];
    uVar1 = local_78 & 0xff;
    switch(uVar1) {
    case 0:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
      if (local_78 >> 0x18 < (local_78 >> 8 & 0x7f)) {
        pcVar3 = getobjname(_reg_local,usertype._4_4_,local_78 >> 0x18,_type);
        return pcVar3;
      }
      break;
    case 1:
    case 2:
      if (uVar1 == 1) {
        local_78 = local_78 >> 0x10;
      }
      else {
        local_78 = _reg_local->code[usertype._4_4_ + 1] >> 8;
      }
      if ((_reg_local->k[(int)local_78].tt_ & 0xf) == 4) {
        if ((_reg_local->k[(int)local_78].tt_ & 0xf) != 4) {
          __assert_fail("(((((((&p->k[b]))->tt_)) & 0x0F)) == (4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0x1f9,"const char *getobjname(Proto *, int, int, const char **)");
        }
        if (((_reg_local->k[(int)local_78].value_.gc)->tt & 0xf) == 4) {
          *_type = (char *)(_reg_local->k[(int)local_78].value_.f + 0x18);
          p_local = (Proto *)anon_var_dwarf_73f4;
          return (char *)p_local;
        }
        __assert_fail("(((((&p->k[b])->value_).gc)->tt) & 0x0F) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x1f9,"const char *getobjname(Proto *, int, int, const char **)");
      }
      break;
    default:
      break;
    case 5:
      pcVar3 = upvalname(_reg_local,local_78 >> 0x18);
      *_type = pcVar3;
      p_local = (Proto *)0x1a0b27;
      return (char *)p_local;
    case 6:
    case 7:
    case 0x50:
    case 0x51:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x73:
      if ((uVar1 == 6) || (uVar1 == 0x73)) {
        local_70 = upvalname(_reg_local,local_78 >> 0x18);
      }
      else {
        local_70 = luaF_getlocalname(_reg_local,(local_78 >> 0x18) + 1,usertype._4_4_,
                                     (ravi_type_map *)&usertype,(TString **)&op);
      }
      kname(_reg_local,usertype._4_4_,local_78 >> 0x10 & 0xff,_type);
      bVar4 = false;
      if (local_70 != (char *)0x0) {
        iVar2 = strcmp(local_70,"_ENV");
        bVar4 = iVar2 == 0;
      }
      if (!bVar4) {
        return "field";
      }
      return "global";
    case 0xc:
    case 0x6d:
    case 0x71:
      kname(_reg_local,usertype._4_4_,local_78 >> 0x10 & 0xff,_type);
      p_local = (Proto *)0x19496e;
      return (char *)p_local;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *getobjname (Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  ravi_type_map type;
  TString *usertype;
  *name = luaF_getlocalname(p, reg + 1, lastpc, &type, &usertype);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_RAVI_MOVEI:
      case OP_RAVI_MOVEF:
      case OP_RAVI_MOVEFARRAY:
      case OP_RAVI_MOVEIARRAY:
      case OP_RAVI_MOVETAB:
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_RAVI_GETI:
      case OP_RAVI_TABLE_GETFIELD:
      case OP_RAVI_GETFIELD:
      case OP_RAVI_IARRAY_GET:
      case OP_RAVI_FARRAY_GET:
      case OP_GETTABUP:
      case OP_RAVI_GETTABUP_SK:
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        int t = GETARG_B(i);  /* table index */
        const char *vn = (op != OP_GETTABUP && op != OP_RAVI_GETTABUP_SK)  /* name of indexed variable */
                         ? luaF_getlocalname(p, t + 1, pc, &type, &usertype)  /* t+1 is the local variable number */
                         : upvalname(p, t);
        kname(p, pc, k, name);
        return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_RAVI_SELF_SK:
      case OP_RAVI_TABLE_SELF_SK:
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, pc, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}